

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_serializer.cpp
# Opt level: O3

vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
* net_serializer<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_void>
  ::deserialize(vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                *__return_storage_ptr__,istream *in)

{
  pointer pvVar1;
  pointer pdVar2;
  pointer pdVar3;
  undefined1 uVar4;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *__range2;
  vector<double,_std::allocator<double>_> *i_1;
  pointer pvVar5;
  size_t i;
  long lVar6;
  uint8_t buf [4];
  vector<double,_std::allocator<double>_> local_48;
  
  lVar6 = 0;
  do {
    uVar4 = std::istream::get();
    *(undefined1 *)
     ((long)&local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start + lVar6) = uVar4;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 4);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(__return_storage_ptr__,
           (long)(int)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,(allocator_type *)&local_48);
  pvVar1 = (__return_storage_ptr__->
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (pvVar5 = (__return_storage_ptr__->
                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start; pvVar5 != pvVar1; pvVar5 = pvVar5 + 1) {
    net_serializer<std::vector<double,_std::allocator<double>_>,_void>::deserialize(&local_48,in);
    pdVar2 = (pvVar5->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar3 = (pvVar5->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    (pvVar5->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
    _M_start = local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
    (pvVar5->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
    _M_finish = local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish;
    (pvVar5->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    if ((pdVar2 != (pointer)0x0) &&
       (operator_delete(pdVar2,(long)pdVar3 - (long)pdVar2),
       local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_start != (pointer)0x0)) {
      operator_delete(local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static std::vector<T> deserialize(std::istream& in){
        int size = net_serializer<int>::deserialize(in);
        std::vector<T> data(size);
        for (auto& i:data)
            i = net_serializer<T>::deserialize(in);
        return data;
    }